

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t environment_00;
  _Bool _Var1;
  _Bool isExternal_00;
  _Bool isThreadLocal_00;
  _Bool _Var2;
  sysbvm_tuple_t symbol;
  undefined1 auStack_b8 [4];
  _Bool isPublic;
  _Bool isThreadLocal;
  _Bool isExternal;
  _Bool isMutable;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_astVariableDefinitionNode_t **variableDefinitionNode;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_56_7_c1bcb7ce gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.ownerProgramEntity = (sysbvm_tuple_t)(arguments + 1);
  memset(&gcFrameRecord.roots,0,0x38);
  memset(&variableDefinitionNode,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&variableDefinitionNode);
  _auStack_b8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sourcePositionRecord.sourcePosition = (sysbvm_tuple_t)arguments;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                 (context,*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x28),
                  *(sysbvm_tuple_t *)gcFrame.ownerProgramEntity);
  _Var1 = sysbvm_tuple_boolean_decode
                    (*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x48));
  if (_Var1) {
    sysbvm_environment_setNewMacroValueBinding
              (context,*(sysbvm_tuple_t *)gcFrame.ownerProgramEntity,
               *(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x10),
               (sysbvm_tuple_t)gcFrameRecord.roots,
               *(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x38));
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&variableDefinitionNode);
    context_local = (sysbvm_context_t *)0x2f;
  }
  else {
    if (*(long *)(*(long *)sourcePositionRecord.sourcePosition + 0x30) != 0) {
      gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                               (context,*(sysbvm_tuple_t *)
                                         (*(long *)sourcePositionRecord.sourcePosition + 0x30),
                                *(sysbvm_tuple_t *)gcFrame.ownerProgramEntity);
    }
    if (*(long *)(*(long *)sourcePositionRecord.sourcePosition + 0x38) != 0) {
      gcFrame.valueBox =
           (sysbvm_variableValueBox_t *)
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)
                               (*(long *)sourcePositionRecord.sourcePosition + 0x38),
                      *(sysbvm_tuple_t *)gcFrame.ownerProgramEntity);
    }
    if (gcFrame.name != 0) {
      gcFrame.valueBox =
           (sysbvm_variableValueBox_t *)
           sysbvm_type_coerceValue(context,gcFrame.name,(sysbvm_tuple_t)gcFrame.valueBox);
    }
    _Var1 = sysbvm_tuple_boolean_decode
                      (*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x50));
    isExternal_00 =
         sysbvm_tuple_boolean_decode
                   (*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x60));
    isThreadLocal_00 =
         sysbvm_tuple_boolean_decode
                   (*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x68));
    if (_Var1) {
      if (gcFrame.name == 0) {
        gcFrame.name = sysbvm_tuple_getType(context,(sysbvm_tuple_t)gcFrame.valueBox);
      }
      gcFrame.name = sysbvm_type_createGenericReferenceType(context,gcFrame.name);
      gcFrame.type = sysbvm_variableValueBox_with(context,(sysbvm_tuple_t)gcFrame.valueBox);
      gcFrame.valueBox =
           (sysbvm_variableValueBox_t *)
           sysbvm_referenceType_withStorage(context,gcFrame.name,gcFrame.type);
    }
    _Var2 = sysbvm_tuple_boolean_decode
                      (*(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x58));
    if (_Var2) {
      environment_00 = *(sysbvm_tuple_t *)gcFrame.ownerProgramEntity;
      symbol = sysbvm_symbol_internWithCString(context,"__OwnerProgramEntity__");
      _Var2 = sysbvm_environment_lookSymbolRecursively
                        (context,environment_00,symbol,&gcFrame.binding);
      if (!_Var2) {
        sysbvm_error("Failed to find __OwnerProgramEntity__");
      }
      _Var2 = sysbvm_symbolBinding_isValue(context,gcFrame.binding);
      if (!_Var2) {
        sysbvm_error("Expected a symbol value binding for __OwnerProgramEntity__");
      }
      gcFrame.ownerProgramEntitySymbol = sysbvm_symbolValueBinding_getValue(gcFrame.binding);
      _Var2 = sysbvm_tuple_isKindOf
                        (context,gcFrame.ownerProgramEntitySymbol,(context->roots).environmentType);
      if (_Var2) {
        gcFrame.value =
             sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition
                       (context,gcFrame.ownerProgramEntitySymbol,(sysbvm_tuple_t)gcFrameRecord.roots
                        ,(sysbvm_tuple_t)gcFrame.valueBox,_Var1,isExternal_00,isThreadLocal_00,
                        *(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x10));
      }
      else {
        sysbvm_error("TODO: Set public symbol in non-environment owner.");
      }
    }
    else {
      gcFrame.value =
           sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition
                     (context,*(sysbvm_tuple_t *)gcFrame.ownerProgramEntity,
                      (sysbvm_tuple_t)gcFrameRecord.roots,(sysbvm_tuple_t)gcFrame.valueBox,_Var1,
                      isExternal_00,isThreadLocal_00,
                      *(sysbvm_tuple_t *)(*(long *)sourcePositionRecord.sourcePosition + 0x10));
    }
    if (((_Var1) && (gcFrame.value != 0)) && (gcFrame.type != 0)) {
      *(sysbvm_tuple_t *)(gcFrame.type + 0x18) = gcFrame.value;
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_b8);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&variableDefinitionNode);
    context_local = (sysbvm_context_t *)gcFrame.valueBox;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t name;
        sysbvm_tuple_t type;
        sysbvm_variableValueBox_t *valueBox;
        sysbvm_tuple_t value;
        sysbvm_tuple_t binding;
        sysbvm_tuple_t ownerProgramEntitySymbol;
        sysbvm_tuple_t ownerProgramEntity;
    } gcFrame = {
        .value = SYSBVM_NULL_TUPLE
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_astVariableDefinitionNode_t **variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*variableDefinitionNode)->super.sourcePosition);

    gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*variableDefinitionNode)->nameExpression, *environment);
    if(sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMacroSymbol))
    {
        sysbvm_environment_setNewMacroValueBinding(context, *environment, (*variableDefinitionNode)->super.sourcePosition, gcFrame.name, (*variableDefinitionNode)->valueExpression);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return SYSBVM_VOID_TUPLE;
    }

    if((*variableDefinitionNode)->typeExpression)
        gcFrame.type = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*variableDefinitionNode)->typeExpression, *environment);
    if((*variableDefinitionNode)->valueExpression)
        gcFrame.value = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*variableDefinitionNode)->valueExpression, *environment);
    if(gcFrame.type)
        gcFrame.value = sysbvm_type_coerceValue(context, gcFrame.type, gcFrame.value);

    bool isMutable = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMutable);
    bool isExternal = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isExternal);
    bool isThreadLocal = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isThreadLocal);
    if(isMutable)
    {
        if(!gcFrame.type)
            gcFrame.type = sysbvm_tuple_getType(context, gcFrame.value);
        gcFrame.type = sysbvm_type_createGenericReferenceType(context, gcFrame.type);
        gcFrame.valueBox = (sysbvm_variableValueBox_t*)sysbvm_variableValueBox_with(context, gcFrame.value);
        gcFrame.value = sysbvm_referenceType_withStorage(context, gcFrame.type, (sysbvm_tuple_t)gcFrame.valueBox);
    }

    bool isPublic = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isPublic);
    if(isPublic)
    {
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, sysbvm_symbol_internWithCString(context, "__OwnerProgramEntity__"), &gcFrame.ownerProgramEntitySymbol))
            sysbvm_error("Failed to find __OwnerProgramEntity__");
        if(!sysbvm_symbolBinding_isValue(context, gcFrame.ownerProgramEntitySymbol))
            sysbvm_error("Expected a symbol value binding for __OwnerProgramEntity__");

        gcFrame.ownerProgramEntity = sysbvm_symbolValueBinding_getValue(gcFrame.ownerProgramEntitySymbol);
        if(sysbvm_tuple_isKindOf(context, gcFrame.ownerProgramEntity, context->roots.environmentType))
            gcFrame.binding = sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition(context, gcFrame.ownerProgramEntity, gcFrame.name, gcFrame.value, isMutable, isExternal, isThreadLocal, (*variableDefinitionNode)->super.sourcePosition);
        else
            sysbvm_error("TODO: Set public symbol in non-environment owner.");
    }
    else
    {
        gcFrame.binding = sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition(context, *environment, gcFrame.name, gcFrame.value, isMutable, isExternal, isThreadLocal, (*variableDefinitionNode)->super.sourcePosition);
    }

    // Store a copy of the binding itself in the value box.
    if(isMutable && gcFrame.binding && gcFrame.valueBox)
        gcFrame.valueBox->binding = gcFrame.binding;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.value;
}